

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O2

boolean in_fcorridor(monst *grd,int x,int y)

{
  long lVar1;
  char *pcVar2;
  
  lVar1 = (long)*(int *)&grd->field_0x74;
  pcVar2 = (char *)((long)grd[1].mtrack + lVar1 * 3 + -0x33);
  while( true ) {
    if (*(int *)&grd[1].nmon <= lVar1) {
      return '\0';
    }
    if ((pcVar2[-1] == x) && (*pcVar2 == y)) break;
    lVar1 = lVar1 + 1;
    pcVar2 = pcVar2 + 3;
  }
  return '\x01';
}

Assistant:

static boolean in_fcorridor(struct monst *grd, int x, int y)
{
	int fci;

	for (fci = EGD(grd)->fcbeg; fci < EGD(grd)->fcend; fci++)
		if (x == EGD(grd)->fakecorr[fci].fx &&
				y == EGD(grd)->fakecorr[fci].fy)
			return TRUE;
	return FALSE;
}